

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_substring_after
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  lyd_node *plVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  lys_node *plVar6;
  char *pcVar7;
  long lVar8;
  uint16_t str_len;
  uint32_t uVar9;
  uint uVar10;
  ly_ctx *plVar11;
  int iVar12;
  
  plVar1 = *args;
  if ((options & 0x1cU) == 0) {
    iVar3 = lyxp_set_cast(plVar1,LYXP_SET_STRING,cur_node,param_4,options);
    iVar12 = -1;
    if (iVar3 == 0) {
      iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      iVar12 = -1;
      if (iVar3 == 0) {
        pcVar7 = (args[1]->val).str;
        pcVar4 = strstr(((*args)->val).str,pcVar7);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "";
          str_len = 0;
        }
        else {
          sVar5 = strlen(pcVar7);
          pcVar4 = pcVar4 + sVar5;
          sVar5 = strlen(pcVar4);
          str_len = (uint16_t)sVar5;
        }
        set_fill_string(set,pcVar4,str_len);
        iVar12 = 0;
      }
    }
  }
  else {
    iVar12 = 0;
    if (plVar1->type == LYXP_SET_SNODE_SET) {
      uVar9 = plVar1->used;
      do {
        uVar9 = uVar9 - 1;
        if ((plVar1->val).nodes[uVar9].pos == 1) {
          plVar2 = (plVar1->val).nodes[uVar9].node;
          if (plVar2 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar2->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar11 = param_4->ctx;
            plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar2->ht);
            pcVar7 = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            iVar3 = warn_is_string_type((lys_type *)&plVar2[1].ht);
            iVar12 = 0;
            if (iVar3 != 0) break;
            plVar11 = param_4->ctx;
            plVar6 = plVar2->schema;
            pcVar7 = "Argument #1 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",plVar6);
          iVar12 = 1;
          break;
        }
      } while (uVar9 != 0);
    }
    plVar1 = args[1];
    if (plVar1->type == LYXP_SET_SNODE_SET) {
      uVar10 = plVar1->used;
      do {
        uVar10 = uVar10 - 1;
        if ((plVar1->val).nodes[uVar10].pos == 1) {
          plVar2 = (plVar1->val).nodes[uVar10].node;
          if (plVar2 == (lyd_node *)0x0) break;
          if ((*(LYS_NODE *)&plVar2->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            plVar11 = param_4->ctx;
            plVar6 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar2->ht);
            pcVar7 = "Argument #2 of %s is a %s node \"%s\".";
          }
          else {
            iVar3 = warn_is_string_type((lys_type *)&plVar2[1].ht);
            if (iVar3 != 0) break;
            plVar11 = param_4->ctx;
            plVar6 = plVar2->schema;
            pcVar7 = "Argument #2 of %s is node \"%s\", not of string-type.";
          }
          ly_log(plVar11,LY_LLWRN,LY_SUCCESS,pcVar7,"xpath_substring_after",plVar6);
          iVar12 = 1;
          break;
        }
      } while (uVar10 != 0);
    }
    uVar10 = set->used;
    if ((ulong)uVar10 != 0) {
      lVar8 = 0;
      do {
        if (*(int *)((long)&((set->val).nodes)->pos + lVar8) == 1) {
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar8) = 0;
        }
        lVar8 = lVar8 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar8);
    }
  }
  return iVar12;
}

Assistant:

static int
xpath_substring_after(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                      struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    char *ptr;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return EXIT_SUCCESS;
}